

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void writeLengthField(FILE *outFile,uint32_t dataLength)

{
  int i;
  long lVar1;
  uint8_t sizeFieldBytes [4];
  
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    sizeFieldBytes[lVar1] = (uint8_t)dataLength;
    dataLength = dataLength >> 8;
  }
  fwrite(sizeFieldBytes,4,1,(FILE *)outFile);
  return;
}

Assistant:

void writeLengthField(FILE* outFile, uint32_t dataLength){
	uint32_t sizeField;
	uint8_t sizeFieldBytes[4];
	sizeField = dataLength;
	for(int i = 0; i < 4; i++){
		sizeFieldBytes[i] = (uint8_t)(0xff & sizeField);
		sizeField >>= 8;
	}

	fwrite(sizeFieldBytes, 4, 1, outFile);
}